

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::internalize(Literal *__return_storage_ptr__,Literal *this)

{
  Type left;
  element_type *peVar1;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  HeapType HVar4;
  Type local_50;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  left.id = (this->type).id;
  wasm::Type::Type(&local_50,(HeapType)0x0,Nullable);
  bVar3 = wasm::Type::isSubType(left,local_50);
  if (!bVar3) {
    __assert_fail("Type::isSubType(type, Type(HeapType::ext, Nullable)) && \"can only internalize external references\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0xa3e,"Literal wasm::Literal::internalize() const");
  }
  bVar3 = wasm::Type::isNull(&this->type);
  if (bVar3) {
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&local_38,(HeapType)0xb);
    p_Var2 = &local_38;
  }
  else {
    peVar1 = (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1->type).id == 4) {
      HVar4 = wasm::Type::getHeapType
                        ((Type *)((long)(peVar1->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                                        ._M_elems + 0x10));
      if (HVar4.id == 4) {
        Literal(__return_storage_ptr__,
                (((this->field_0).gcData.
                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->values).
                super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
        return __return_storage_ptr__;
      }
      __assert_fail("gcData->values[0].type.getHeapType() == HeapType::i31",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0xa43,"Literal wasm::Literal::internalize() const");
    }
    std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,(__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this);
    Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&local_48,
            (HeapType)
            (((this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->type).id);
    p_Var2 = &local_48;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::internalize() const {
  assert(Type::isSubType(type, Type(HeapType::ext, Nullable)) &&
         "can only internalize external references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapType::none);
  }
  if (gcData->type == HeapType::i31) {
    assert(gcData->values[0].type.getHeapType() == HeapType::i31);
    return gcData->values[0];
  }
  return Literal(gcData, gcData->type);
}